

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O2

NumberParseMatcher * __thiscall
icu_63::numparse::impl::AffixTokenMatcherWarehouse::currency
          (AffixTokenMatcherWarehouse *this,UErrorCode *status)

{
  AffixTokenMatcherSetupData *pAVar1;
  CombinedCurrencyMatcher *pCVar2;
  CombinedCurrencyMatcher CStack_2e8;
  
  pAVar1 = this->fSetupData;
  CombinedCurrencyMatcher::CombinedCurrencyMatcher
            (&CStack_2e8,pAVar1->currencySymbols,pAVar1->dfs,pAVar1->parseFlags,status);
  pCVar2 = CombinedCurrencyMatcher::operator=(&this->fCurrency,&CStack_2e8);
  CombinedCurrencyMatcher::~CombinedCurrencyMatcher(&CStack_2e8);
  return &pCVar2->super_NumberParseMatcher;
}

Assistant:

NumberParseMatcher& AffixTokenMatcherWarehouse::currency(UErrorCode& status) {
    return fCurrency = {fSetupData->currencySymbols, fSetupData->dfs, fSetupData->parseFlags, status};
}